

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O3

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_fixed<unsigned_long>
          (basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,unsigned_long value)

{
  assert_error *this_00;
  unsigned_long local_18;
  
  local_18 = value;
  if (this->m_pos == 0) {
    if (this->m_data != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::append((char *)this->m_data,(ulong)&local_18);
      return;
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
  }
  else {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_fixed(T value) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
#if PROTOZERO_BYTE_ORDER != PROTOZERO_LITTLE_ENDIAN
        byteswap_inplace(&value);
#endif
        buffer_customization<TBuffer>::append(m_data, reinterpret_cast<const char*>(&value), sizeof(T));
    }